

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O2

int aes_init(aes_context *ctx,uint8_t *key,int bits)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint32_t *puVar5;
  long lVar6;
  int iVar7;
  
  if (bits == 0x100) {
    ctx->nr = 0xe;
    uVar1 = get32be(key);
    ctx->key[0] = uVar1;
    uVar2 = get32be(key + 4);
    ctx->key[1] = uVar2;
    uVar2 = get32be(key + 8);
    ctx->key[2] = uVar2;
    uVar2 = get32be(key + 0xc);
    ctx->key[3] = uVar2;
    uVar2 = get32be(key + 0x10);
    ctx->key[4] = uVar2;
    uVar2 = get32be(key + 0x14);
    ctx->key[5] = uVar2;
    uVar2 = get32be(key + 0x18);
    ctx->key[6] = uVar2;
    uVar2 = get32be(key + 0x1c);
    ctx->key[7] = uVar2;
    puVar5 = ctx->key + 0xf;
    for (lVar6 = 0; lVar6 != 7; lVar6 = lVar6 + 1) {
      uVar2 = puVar5[-8];
      uVar3 = setup_mix(uVar2);
      uVar1 = uVar1 ^ uVar3 ^ (uint)rcon[lVar6] << 0x18;
      puVar5[-7] = uVar1;
      puVar5[-6] = puVar5[-0xe] ^ uVar1;
      uVar4 = puVar5[-0xe] ^ uVar1 ^ puVar5[-0xd];
      puVar5[-5] = uVar4;
      uVar4 = uVar4 ^ puVar5[-0xc];
      puVar5[-4] = uVar4;
      uVar4 = ((uint)Te[uVar4 & 0xff] |
              (uint)Te[uVar4 >> 8 & 0xff] << 8 |
              (uint)Te[uVar4 >> 0x10 & 0xff] << 0x10 | (uint)Te[uVar4 >> 0x18] << 0x18) ^
              puVar5[-0xb];
      puVar5[-3] = uVar4;
      uVar4 = uVar4 ^ puVar5[-10];
      puVar5[-2] = uVar4;
      uVar4 = uVar4 ^ puVar5[-9];
      puVar5[-1] = uVar4;
      *puVar5 = uVar4 ^ uVar2;
      puVar5 = puVar5 + 8;
    }
    iVar7 = 0;
  }
  else if (bits == 0x80) {
    ctx->nr = 10;
    uVar1 = get32be(key);
    ctx->key[0] = uVar1;
    uVar2 = get32be(key + 4);
    ctx->key[1] = uVar2;
    uVar2 = get32be(key + 8);
    ctx->key[2] = uVar2;
    uVar2 = get32be(key + 0xc);
    ctx->key[3] = uVar2;
    puVar5 = ctx->key + 7;
    iVar7 = 0;
    for (lVar6 = 0; lVar6 != 10; lVar6 = lVar6 + 1) {
      uVar2 = puVar5[-4];
      uVar3 = setup_mix(uVar2);
      uVar1 = uVar1 ^ uVar3 ^ (uint)rcon[lVar6] << 0x18;
      puVar5[-3] = uVar1;
      puVar5[-2] = puVar5[-6] ^ uVar1;
      uVar4 = puVar5[-6] ^ uVar1 ^ puVar5[-5];
      puVar5[-1] = uVar4;
      *puVar5 = uVar4 ^ uVar2;
      puVar5 = puVar5 + 4;
    }
  }
  else {
    iVar7 = -1;
  }
  return iVar7;
}

Assistant:

int aes_init(aes_context* ctx, const uint8_t* key, int bits)
{
    switch(bits) {
        case 128: ctx->nr = 10; break;
        case 256: ctx->nr = 14; break;
        default: return -1;
    }
#if PLATFORM_SUPPORTS_AESNI
    if (aes_supported_x86())
    {
        aes_init_x86(ctx, key);
        return 0;
    }
#endif

    uint32_t* ekey = ctx->key;
    switch(bits) {
        case 128:
            ekey[0] = get32be(key +  0);
            ekey[1] = get32be(key +  4);
            ekey[2] = get32be(key +  8);
            ekey[3] = get32be(key + 12);

            for (size_t i=0; i<10; i++)
            {
                ekey[4] = ekey[0] ^ setup_mix(ekey[3]) ^ (rcon[i] << 24);
                ekey[5] = ekey[1] ^ ekey[4];
                ekey[6] = ekey[2] ^ ekey[5];
                ekey[7] = ekey[3] ^ ekey[6];
                ekey += 4;
            }
            break;
        case 256:
            ekey[0] = get32be(key +  0);
            ekey[1] = get32be(key +  4);
            ekey[2] = get32be(key +  8);
            ekey[3] = get32be(key + 12);
            ekey[4] = get32be(key + 16);
            ekey[5] = get32be(key + 20);
            ekey[6] = get32be(key + 24);
            ekey[7] = get32be(key + 28);

            for (size_t i=0; i<7; i++)
            {
                ekey[8]  = ekey[0] ^ setup_mix(ekey[7]) ^ (rcon[i] << 24);
                ekey[9]  = ekey[1] ^ ekey[8];
                ekey[10] = ekey[2] ^ ekey[9];
                ekey[11] = ekey[3] ^ ekey[10];
                ekey[12] = ekey[4] ^ setup_mix3(ekey[11]);
                ekey[13] = ekey[5] ^ ekey[12];
                ekey[14] = ekey[6] ^ ekey[13];
                ekey[15] = ekey[7] ^ ekey[14];
                ekey += 8;
            }
            break;
    }

    return 0;
}